

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.cc
# Opt level: O0

size_type __thiscall absl::string_view::rfind(string_view *this,string_view s,size_type pos)

{
  bool bVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  size_type local_78;
  char *result;
  char *local_38;
  char *last;
  size_type pos_local;
  string_view *this_local;
  string_view s_local;
  
  s_local.ptr_ = (char *)s.length_;
  this_local = (string_view *)s.ptr_;
  if ((char *)this->length_ < s_local.ptr_) {
    s_local.length_ = 0xffffffffffffffff;
  }
  else {
    last = (char *)pos;
    pos_local = (size_type)this;
    bVar1 = empty((string_view *)&this_local);
    if (bVar1) {
      puVar2 = std::min<unsigned_long>(&this->length_,(unsigned_long *)&last);
      s_local.length_ = *puVar2;
    }
    else {
      pcVar3 = this->ptr_;
      result = (char *)(this->length_ - (long)s_local.ptr_);
      puVar2 = std::min<unsigned_long>((unsigned_long *)&result,(unsigned_long *)&last);
      local_38 = s_local.ptr_ + (long)(pcVar3 + *puVar2);
      pcVar3 = std::find_end<char_const*,char_const*>
                         (this->ptr_,local_38,(char *)this_local,
                          s_local.ptr_ + (long)&this_local->ptr_);
      if (pcVar3 == local_38) {
        local_78 = 0xffffffffffffffff;
      }
      else {
        local_78 = (long)pcVar3 - (long)this->ptr_;
      }
      s_local.length_ = local_78;
    }
  }
  return s_local.length_;
}

Assistant:

string_view::size_type string_view::rfind(string_view s, size_type pos) const
    noexcept {
  if (length_ < s.length_) return npos;
  if (s.empty()) return std::min(length_, pos);
  const char* last = ptr_ + std::min(length_ - s.length_, pos) + s.length_;
  const char* result = std::find_end(ptr_, last, s.ptr_, s.ptr_ + s.length_);
  return result != last ? result - ptr_ : npos;
}